

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O3

bool __thiscall
QMakeEvaluator::getMemberArgs
          (QMakeEvaluator *this,ProKey *func,int srclen,ProStringList *args,int *start,int *end)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ProString *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  bool ok;
  QString local_88;
  ProString local_70;
  bool local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *start = 0;
  *end = 0;
  if ((ulong)(args->super_QList<ProString>).d.size < 2) {
LAB_00267d9c:
    iVar2 = *start;
    if (iVar2 < 0) {
      iVar2 = iVar2 + srclen;
      *start = iVar2;
    }
    iVar3 = *end;
    if (iVar3 < 0) {
      iVar3 = iVar3 + srclen;
      *end = iVar3;
      iVar2 = *start;
    }
    if (iVar2 < srclen && -1 < iVar2) {
      bVar1 = iVar3 < srclen && -1 < iVar3;
      goto LAB_00267e8a;
    }
  }
  else {
    local_39 = true;
    this_00 = (args->super_QList<ProString>).d.ptr + 1;
    iVar2 = ProString::toInt(this_00,&local_39,10);
    *start = iVar2;
    if (local_39 == false) {
      if ((args->super_QList<ProString>).d.size == 2) {
        iVar2 = ProString::indexOf(this_00,(QString *)(QMakeInternal::statics + 0xf0),0,
                                   CaseSensitive);
        if (iVar2 != -1) {
          ProString::mid(&local_70,this_00,0,iVar2);
          iVar3 = ProString::toInt(&local_70,&local_39,10);
          *start = iVar3;
          if (&(local_70.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_70.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_70.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_70.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_70.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (local_39 == true) {
            ProString::mid(&local_70,this_00,iVar2 + 2,-1);
            iVar2 = ProString::toInt(&local_70,&local_39,10);
            *end = iVar2;
            if (&(local_70.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_70.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_70.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_70.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i == 0) {
                QArrayData::deallocate(&(local_70.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
        }
      }
      if (local_39 != false) goto LAB_00267d9c;
      ProString::toQString(&func->super_ProString,&this->m_tmp1);
      ProString::toQString(this_00,&this->m_tmp2);
      QVar5.m_data = (storage_type *)0x25;
      QVar5.m_size = (qsizetype)&local_88;
      QString::fromLatin1(QVar5);
      QString::arg<QString&,QString&>(&local_70.m_string,&local_88,&this->m_tmp1,&this->m_tmp2);
    }
    else {
      *end = iVar2;
      if ((args->super_QList<ProString>).d.size == 3) {
        iVar2 = ProString::toInt((args->super_QList<ProString>).d.ptr + 2,&local_39,10);
        *end = iVar2;
      }
      if ((local_39 & 1U) != 0) goto LAB_00267d9c;
      ProString::toQString(&func->super_ProString,&this->m_tmp1);
      ProString::toQString((args->super_QList<ProString>).d.ptr + 2,&this->m_tmp2);
      QVar4.m_data = (storage_type *)0x23;
      QVar4.m_size = (qsizetype)&local_88;
      QString::fromLatin1(QVar4);
      QString::arg<QString&,QString&>(&local_70.m_string,&local_88,&this->m_tmp1,&this->m_tmp2);
    }
    message(this,0x310,&local_70.m_string);
    if (&(local_70.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_70.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_70.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  bVar1 = false;
LAB_00267e8a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool
QMakeEvaluator::getMemberArgs(const ProKey &func, int srclen, const ProStringList &args,
                              int *start, int *end)
{
    *start = 0, *end = 0;
    if (args.size() >= 2) {
        bool ok = true;
        const ProString &start_str = args.at(1);
        *start = start_str.toInt(&ok);
        if (!ok) {
            if (args.size() == 2) {
                int dotdot = start_str.indexOf(statics.strDotDot);
                if (dotdot != -1) {
                    *start = start_str.left(dotdot).toInt(&ok);
                    if (ok)
                        *end = start_str.mid(dotdot+2).toInt(&ok);
                }
            }
            if (!ok) {
                ProStringRoUser u1(func, m_tmp1);
                ProStringRoUser u2(start_str, m_tmp2);
                evalError(fL1S("%1() argument 2 (start) '%2' invalid.").arg(u1.str(), u2.str()));
                return false;
            }
        } else {
            *end = *start;
            if (args.size() == 3)
                *end = args.at(2).toInt(&ok);
            if (!ok) {
                ProStringRoUser u1(func, m_tmp1);
                ProStringRoUser u2(args.at(2), m_tmp2);
                evalError(fL1S("%1() argument 3 (end) '%2' invalid.").arg(u1.str(), u2.str()));
                return false;
            }
        }
    }
    if (*start < 0)
        *start += srclen;
    if (*end < 0)
        *end += srclen;
    if (*start < 0 || *start >= srclen || *end < 0 || *end >= srclen)
        return false;
    return true;
}